

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
jbcoin::SerialIter::getRawHelper<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          SerialIter *this,int size)

{
  uchar *__dest;
  allocator<unsigned_char> local_1e;
  undefined1 local_1d;
  int local_1c;
  SerialIter *pSStack_18;
  int size_local;
  SerialIter *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  
  local_1c = size;
  pSStack_18 = this;
  this_local = (SerialIter *)__return_storage_ptr__;
  if ((ulong)(long)size <= this->remain_) {
    local_1d = 0;
    std::allocator<unsigned_char>::allocator(&local_1e);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,(long)size,&local_1e);
    std::allocator<unsigned_char>::~allocator(&local_1e);
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       (__return_storage_ptr__);
    memcpy(__dest,this->p_,(long)local_1c);
    this->p_ = this->p_ + local_1c;
    this->used_ = (long)local_1c + this->used_;
    this->remain_ = this->remain_ - (long)local_1c;
    return __return_storage_ptr__;
  }
  Throw<std::runtime_error,char_const(&)[26]>((char (*) [26])"invalid SerialIter getRaw");
}

Assistant:

T SerialIter::getRawHelper (int size)
{
    static_assert(std::is_same<T, Blob>::value ||
                  std::is_same<T, Buffer>::value, "");
    if (remain_ < size)
        Throw<std::runtime_error> (
            "invalid SerialIter getRaw");
    T result (size);
    memcpy(result.data (), p_, size);
    p_ += size;
    used_ += size;
    remain_ -= size;
    return result;
}